

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatNode
                (StringBuilder *sb,uint32_t logOptions,CodeBuilder *cb,CBNode *node_)

{
  Error EVar1;
  Error EVar2;
  uint uVar3;
  ulong uVar4;
  Error unaff_EBX;
  uint32_t logOptions_00;
  char *pcVar5;
  FuncDetail *in_R8;
  VirtReg **in_R9;
  CBData *node;
  bool bVar6;
  
  logOptions_00 = logOptions;
  if (node_->_position != 0) {
    logOptions_00 = 0x1351cf;
    unaff_EBX = StringBuilder::appendFormat(sb,"<%04u> ");
    if (unaff_EBX != 0) {
      return unaff_EBX;
    }
  }
  uVar4 = (ulong)node_->_type;
  switch(node_->_type) {
  case '\x01':
  case '\x12':
    EVar2 = X86Logging::formatInstruction
                      (sb,logOptions,&cb->super_CodeEmitter,
                       (uint)(cb->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,
                       (uint)*(ushort *)&node_[1]._prev,*(uint32_t *)((long)&node_[1]._prev + 4),
                       (Operand_ *)&node_[1]._next,(Operand_ *)node_[1]._inlineComment,
                       (uint)node_->_opCount);
    break;
  case '\x02':
    uVar3 = node_[1]._position;
    pcVar5 = ".embed (%u bytes)";
    goto LAB_0011650d;
  case '\x03':
    pcVar5 = "data";
    if (*(int *)&node_[1]._prev == 0) {
      pcVar5 = "code";
    }
    EVar2 = StringBuilder::appendFormat
                      (sb,".align %u (%s)",(ulong)*(uint *)((long)&node_[1]._prev + 4),pcVar5);
    break;
  case '\x04':
    uVar3 = *(int *)&node_[1]._prev - 0x100;
    pcVar5 = "L%u:";
LAB_0011650d:
    uVar4 = (ulong)uVar3;
LAB_00116539:
    EVar2 = StringBuilder::appendFormat(sb,pcVar5,uVar4);
    break;
  default:
    pcVar5 = "[unknown (type=%u)]";
    goto LAB_00116539;
  case '\a':
    EVar2 = StringBuilder::appendFormat(sb,"; %s",node_->_inlineComment);
    break;
  case '\b':
    pcVar5 = "[sentinel]";
    goto LAB_00116519;
  case '\x10':
    EVar2 = formatLabel(sb,logOptions_00,&cb->super_CodeEmitter,*(uint32_t *)&node_[1]._prev);
    bVar6 = true;
    if ((EVar2 == 0) &&
       (EVar2 = StringBuilder::_opString(sb,1,": [",0xffffffffffffffff), EVar2 == 0)) {
      EVar2 = formatFuncRets((asmjit *)sb,(StringBuilder *)(ulong)logOptions,(uint32_t)cb,
                             (CodeEmitter *)&node_[1]._type,in_R8,in_R9);
      if ((EVar2 == 0) &&
         (((EVar2 = StringBuilder::_opString(sb,1,"]",0xffffffffffffffff), EVar2 == 0 &&
           (EVar2 = StringBuilder::_opString(sb,1,"(",0xffffffffffffffff), EVar2 == 0)) &&
          (EVar2 = formatFuncArgs((asmjit *)sb,(StringBuilder *)(ulong)logOptions,(uint32_t)cb,
                                  (CodeEmitter *)&node_[1]._type,*(FuncDetail **)&node_[8]._type,
                                  in_R9), EVar2 == 0)))) {
        EVar1 = StringBuilder::_opString(sb,1,")",0xffffffffffffffff);
        bVar6 = EVar1 != 0;
        EVar2 = unaff_EBX;
        if (bVar6) {
          EVar2 = EVar1;
        }
      }
    }
    if (bVar6) {
      return EVar2;
    }
    goto LAB_00116547;
  case '\x11':
    pcVar5 = "[ret]";
LAB_00116519:
    EVar2 = StringBuilder::_opString(sb,1,pcVar5,0xffffffffffffffff);
  }
  if (EVar2 == 0) {
LAB_00116547:
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error Logging::formatNode(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeBuilder* cb,
  const CBNode* node_) noexcept {

  if (node_->hasPosition())
    ASMJIT_PROPAGATE(sb.appendFormat("<%04u> ", node_->getPosition()));

  switch (node_->getType()) {
    case CBNode::kNodeInst: {
      const CBInst* node = node_->as<CBInst>();
      ASMJIT_PROPAGATE(
        Logging::formatInstruction(sb, logOptions, cb,
          cb->getArchType(),
          node->getInstId(),
          node->getOptions(),
          node->getExtraOp(),
          node->getOpArray(), node->getOpCount()));
      break;
    }

    case CBNode::kNodeLabel: {
      const CBLabel* node = node_->as<CBLabel>();
      ASMJIT_PROPAGATE(sb.appendFormat("L%u:", Operand::unpackId(node->getId())));
      break;
    }

    case CBNode::kNodeData: {
      const CBData* node = node_->as<CBData>();
      ASMJIT_PROPAGATE(sb.appendFormat(".embed (%u bytes)", node->getSize()));
      break;
    }

    case CBNode::kNodeAlign: {
      const CBAlign* node = node_->as<CBAlign>();
      ASMJIT_PROPAGATE(
        sb.appendFormat(".align %u (%s)",
          node->getAlignment(),
          node->getMode() == kAlignCode ? "code" : "data"));
      break;
    }

    case CBNode::kNodeComment: {
      const CBComment* node = node_->as<CBComment>();
      ASMJIT_PROPAGATE(sb.appendFormat("; %s", node->getInlineComment()));
      break;
    }

    case CBNode::kNodeSentinel: {
      ASMJIT_PROPAGATE(sb.appendString("[sentinel]"));
      break;
    }

#if !defined(ASMJIT_DISABLE_COMPILER)
    case CBNode::kNodeFunc: {
      const CCFunc* node = node_->as<CCFunc>();
      ASMJIT_PROPAGATE(formatLabel(sb, logOptions, cb, node->getId()));

      ASMJIT_PROPAGATE(sb.appendString(": ["));
      ASMJIT_PROPAGATE(formatFuncRets(sb, logOptions, cb, node->getDetail(), nullptr));
      ASMJIT_PROPAGATE(sb.appendString("]"));

      ASMJIT_PROPAGATE(sb.appendString("("));
      ASMJIT_PROPAGATE(formatFuncArgs(sb, logOptions, cb, node->getDetail(), node->getArgs()));
      ASMJIT_PROPAGATE(sb.appendString(")"));
      break;
    }

    case CBNode::kNodeFuncExit: {
      ASMJIT_PROPAGATE(sb.appendString("[ret]"));
      break;
    }

    case CBNode::kNodeFuncCall: {
      const CCFuncCall* node = node_->as<CCFuncCall>();
      ASMJIT_PROPAGATE(
        Logging::formatInstruction(sb, logOptions, cb,
          cb->getArchType(),
          node->getInstId(),
          node->getOptions(),
          node->getExtraOp(),
          node->getOpArray(), node->getOpCount()));
      break;
    }
#endif // !ASMJIT_DISABLE_COMPILER

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[unknown (type=%u)]", node_->getType()));
      break;
    }
  }

  return kErrorOk;
}